

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_int>::btAxisSweep3Internal
          (btAxisSweep3Internal<unsigned_int> *this,btVector3 *worldAabbMin,btVector3 *worldAabbMax,
          uint handleMask,uint handleSentinel,uint userMaxHandles,btOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  ulong uVar3;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  btBroadphaseInterface *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  btVector3 bVar4;
  _func_int **in_stack_00000008;
  byte in_stack_00000010;
  int axis;
  int i_1;
  uint i;
  uint maxInt;
  btVector3 aabbSize;
  void *ptr;
  uint maxHandles;
  _func_int **in_stack_fffffffffffffed8;
  _func_int **in_stack_fffffffffffffee0;
  btVector3 *in_stack_fffffffffffffee8;
  _func_int **pp_Var5;
  btNullPairCache *in_stack_fffffffffffffef0;
  btHashedOverlappingPairCache *in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff38 [16];
  int local_8c;
  int local_88;
  uint local_84;
  float local_80;
  float local_7c;
  float local_78;
  btVector3 local_74;
  _func_int **local_64;
  _func_int **pp_Stack_5c;
  uint local_54;
  btScalar local_50;
  btScalar bStack_4c;
  undefined8 local_48;
  _func_int **local_40;
  uint local_38;
  byte local_25;
  int local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_25 = in_stack_00000010 & 1;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btBroadphaseInterface::btBroadphaseInterface(in_RDI);
  in_RDI->_vptr_btBroadphaseInterface = (_func_int **)&PTR__btAxisSweep3Internal_002e1be0;
  *(undefined4 *)&in_RDI[1]._vptr_btBroadphaseInterface = local_1c;
  *(undefined4 *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 4) = local_20;
  btVector3::btVector3((btVector3 *)(in_RDI + 2));
  btVector3::btVector3((btVector3 *)(in_RDI + 4));
  btVector3::btVector3((btVector3 *)(in_RDI + 6));
  in_RDI[0x11]._vptr_btBroadphaseInterface = in_stack_00000008;
  in_RDI[0x12]._vptr_btBroadphaseInterface = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0x13]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)((long)&in_RDI[0x13]._vptr_btBroadphaseInterface + 4) = 0;
  in_RDI[0x14]._vptr_btBroadphaseInterface = (_func_int **)0x0;
  local_38 = local_24 + 1;
  if (in_RDI[0x11]._vptr_btBroadphaseInterface == (_func_int **)0x0) {
    pp_Var2 = (_func_int **)
              btAlignedAllocInternal
                        ((size_t)in_stack_fffffffffffffee0,
                         (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_40 = pp_Var2;
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(in_stack_ffffffffffffff00);
    in_RDI[0x11]._vptr_btBroadphaseInterface = pp_Var2;
    *(undefined1 *)&in_RDI[0x13]._vptr_btBroadphaseInterface = 1;
  }
  if ((local_25 & 1) == 0) {
    pp_Var2 = (_func_int **)
              btAlignedAllocInternal
                        ((size_t)in_stack_fffffffffffffee0,
                         (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    pp_Var2[2] = (_func_int *)0x0;
    pp_Var2[3] = (_func_int *)0x0;
    *pp_Var2 = (_func_int *)0x0;
    pp_Var2[1] = (_func_int *)0x0;
    pp_Var2[4] = (_func_int *)0x0;
    btNullPairCache::btNullPairCache(in_stack_fffffffffffffef0);
    in_RDI[0x15]._vptr_btBroadphaseInterface = pp_Var2;
    pp_Var2 = (_func_int **)
              btAlignedAllocInternal
                        ((size_t)in_stack_fffffffffffffee0,
                         (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    btDbvtBroadphase::btDbvtBroadphase
              (in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
    in_RDI[0x14]._vptr_btBroadphaseInterface = pp_Var2;
    *(undefined1 *)((long)in_RDI[0x14]._vptr_btBroadphaseInterface + 0x11d) = 1;
  }
  pp_Var2 = (_func_int **)local_10[1];
  in_RDI[2]._vptr_btBroadphaseInterface = (_func_int **)*local_10;
  in_RDI[3]._vptr_btBroadphaseInterface = pp_Var2;
  pp_Var2 = (_func_int **)local_18[1];
  in_RDI[4]._vptr_btBroadphaseInterface = (_func_int **)*local_18;
  in_RDI[5]._vptr_btBroadphaseInterface = pp_Var2;
  bVar4 = operator-((btVector3 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_48 = bVar4.m_floats._8_8_;
  local_50 = bVar4.m_floats[0];
  bStack_4c = bVar4.m_floats[1];
  local_54 = *(uint *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 4);
  local_78 = (float)local_54;
  local_7c = (float)local_54;
  local_80 = (float)local_54;
  btVector3::btVector3(&local_74,&local_78,&local_7c,&local_80);
  bVar4 = operator/((btVector3 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pp_Stack_5c = bVar4.m_floats._8_8_;
  local_64 = bVar4.m_floats._0_8_;
  in_RDI[6]._vptr_btBroadphaseInterface = local_64;
  in_RDI[7]._vptr_btBroadphaseInterface = pp_Stack_5c;
  uVar3 = (ulong)local_38;
  pp_Var2 = (_func_int **)Handle::operator_new__(0x157cc8);
  if (uVar3 != 0) {
    pp_Var5 = pp_Var2 + uVar3 * 0xc;
    pp_Var1 = pp_Var2;
    do {
      in_stack_fffffffffffffee0 = pp_Var1;
      Handle::Handle((Handle *)0x157d07);
      pp_Var1 = in_stack_fffffffffffffee0 + 0xc;
    } while (in_stack_fffffffffffffee0 + 0xc != pp_Var5);
  }
  in_RDI[9]._vptr_btBroadphaseInterface = pp_Var2;
  *(uint *)((long)&in_RDI[8]._vptr_btBroadphaseInterface + 4) = local_38;
  *(undefined4 *)&in_RDI[8]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)&in_RDI[10]._vptr_btBroadphaseInterface = 1;
  for (local_84 = *(uint *)&in_RDI[10]._vptr_btBroadphaseInterface; local_84 < local_38;
      local_84 = local_84 + 1) {
    Handle::SetNextFree((Handle *)(in_RDI[9]._vptr_btBroadphaseInterface + (ulong)local_84 * 0xc),
                        local_84 + 1);
  }
  Handle::SetNextFree((Handle *)
                      (in_RDI[9]._vptr_btBroadphaseInterface + (ulong)(local_38 - 1) * 0xc),0);
  for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
    in_stack_fffffffffffffed8 =
         (_func_int **)
         btAlignedAllocInternal
                   ((size_t)in_stack_fffffffffffffee0,
                    (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    in_RDI[(long)local_88 + 0xe]._vptr_btBroadphaseInterface = in_stack_fffffffffffffed8;
    in_RDI[(long)local_88 + 0xb]._vptr_btBroadphaseInterface =
         in_RDI[(long)local_88 + 0xe]._vptr_btBroadphaseInterface;
  }
  *in_RDI[9]._vptr_btBroadphaseInterface = (_func_int *)0x0;
  for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
    *(undefined4 *)((long)in_RDI[9]._vptr_btBroadphaseInterface + (long)local_8c * 4 + 0x3c) = 0;
    *(undefined4 *)((long)in_RDI[9]._vptr_btBroadphaseInterface + (long)local_8c * 4 + 0x48) = 1;
    *(undefined4 *)in_RDI[(long)local_8c + 0xb]._vptr_btBroadphaseInterface = 0;
    *(undefined4 *)((long)in_RDI[(long)local_8c + 0xb]._vptr_btBroadphaseInterface + 4) = 0;
    *(undefined4 *)(in_RDI[(long)local_8c + 0xb]._vptr_btBroadphaseInterface + 1) =
         *(undefined4 *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 4);
    *(undefined4 *)((long)in_RDI[(long)local_8c + 0xb]._vptr_btBroadphaseInterface + 0xc) = 0;
  }
  return;
}

Assistant:

btAxisSweep3Internal<BP_FP_INT_TYPE>::btAxisSweep3Internal(const btVector3& worldAabbMin,const btVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel,BP_FP_INT_TYPE userMaxHandles, btOverlappingPairCache* pairCache , bool disableRaycastAccelerator)
:m_bpHandleMask(handleMask),
m_handleSentinel(handleSentinel),
m_pairCache(pairCache),
m_userPairCallback(0),
m_ownsPairCache(false),
m_invalidPair(0),
m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles+1);//need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new(ptr) btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (btAlignedAlloc(sizeof(btNullPairCache),16)) btNullPairCache();
		m_raycastAccelerator = new (btAlignedAlloc(sizeof(btDbvtBroadphase),16)) btDbvtBroadphase(m_nullPairCache);//m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;//don't add/remove pairs
	}

	//btAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	btVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE	maxInt = m_handleSentinel;

	m_quantize = btVector3(btScalar(maxInt),btScalar(maxInt),btScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using btAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];
	
	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = btAlignedAlloc(sizeof(Edge)*maxHandles*2,16);
			m_pEdges[i] = new(m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels
	
	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

	}

}